

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

VkResult __thiscall
VmaDefragmentationContext_T::DefragmentPassBegin
          (VmaDefragmentationContext_T *this,VmaDefragmentationPassMoveInfo *moveInfo)

{
  uint32_t uVar1;
  VmaBlockVector *pVVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  VmaDefragmentationMove *pVVar6;
  char cVar7;
  size_t index;
  pthread_rwlock_t *__rwlock;
  
  pVVar2 = this->m_PoolBlockVector;
  if (pVVar2 == (VmaBlockVector *)0x0) {
    if (this->m_BlockVectorCount != 0) {
      index = 0;
      do {
        pVVar2 = this->m_pBlockVectors[index];
        if (pVVar2 != (VmaBlockVector *)0x0) {
          cVar7 = pVVar2->m_hAllocator->m_UseMutex;
          __rwlock = (pthread_rwlock_t *)&pVVar2->m_Mutex;
          if ((bool)cVar7 == false) {
            __rwlock = (pthread_rwlock_t *)0x0;
          }
          if (((bool)cVar7 == true) && (iVar5 = pthread_rwlock_wrlock(__rwlock), iVar5 == 0x23))
          goto LAB_001bf952;
          pVVar2 = this->m_pBlockVectors[index];
          uVar3 = (pVVar2->m_Blocks).m_Count;
          if (uVar3 < 2) {
            if (uVar3 == 1) {
              bVar4 = ReallocWithinBlock(this,pVVar2,*(pVVar2->m_Blocks).m_pArray);
              goto LAB_001bf8db;
            }
          }
          else {
            bVar4 = ComputeDefragmentation(this,pVVar2,index);
LAB_001bf8db:
            if (bVar4 != false) goto LAB_001bf916;
          }
          if ((bool)cVar7 != false) {
            pthread_rwlock_unlock(__rwlock);
          }
        }
        index = index + 1;
      } while (index < this->m_BlockVectorCount);
    }
  }
  else {
    cVar7 = pVVar2->m_hAllocator->m_UseMutex;
    __rwlock = (pthread_rwlock_t *)0x0;
    if ((bool)cVar7 != false) {
      __rwlock = (pthread_rwlock_t *)&pVVar2->m_Mutex;
    }
    if (((bool)cVar7 == true) && (iVar5 = pthread_rwlock_wrlock(__rwlock), iVar5 == 0x23)) {
LAB_001bf952:
      std::__throw_system_error(0x23);
    }
    pVVar2 = this->m_PoolBlockVector;
    uVar3 = (pVVar2->m_Blocks).m_Count;
    if (uVar3 < 2) {
      if (uVar3 == 1) {
        ReallocWithinBlock(this,pVVar2,*(pVVar2->m_Blocks).m_pArray);
      }
    }
    else {
      ComputeDefragmentation(this,pVVar2,0);
    }
LAB_001bf916:
    if (cVar7 != '\0') {
      pthread_rwlock_unlock(__rwlock);
    }
  }
  uVar1 = (uint32_t)(this->m_Moves).m_Count;
  moveInfo->moveCount = uVar1;
  if (uVar1 == 0) {
    pVVar6 = (VmaDefragmentationMove *)0x0;
  }
  else {
    pVVar6 = (this->m_Moves).m_pArray;
  }
  moveInfo->pMoves = pVVar6;
  return (uint)(uVar1 != 0) * 5;
}

Assistant:

VkResult VmaDefragmentationContext_T::DefragmentPassBegin(VmaDefragmentationPassMoveInfo& moveInfo)
{
    if (m_PoolBlockVector != VMA_NULL)
    {
        VmaMutexLockWrite lock(m_PoolBlockVector->GetMutex(), m_PoolBlockVector->GetAllocator()->m_UseMutex);

        if (m_PoolBlockVector->GetBlockCount() > 1)
            ComputeDefragmentation(*m_PoolBlockVector, 0);
        else if (m_PoolBlockVector->GetBlockCount() == 1)
            ReallocWithinBlock(*m_PoolBlockVector, m_PoolBlockVector->GetBlock(0));
    }
    else
    {
        for (uint32_t i = 0; i < m_BlockVectorCount; ++i)
        {
            if (m_pBlockVectors[i] != VMA_NULL)
            {
                VmaMutexLockWrite lock(m_pBlockVectors[i]->GetMutex(), m_pBlockVectors[i]->GetAllocator()->m_UseMutex);

                if (m_pBlockVectors[i]->GetBlockCount() > 1)
                {
                    if (ComputeDefragmentation(*m_pBlockVectors[i], i))
                        break;
                }
                else if (m_pBlockVectors[i]->GetBlockCount() == 1)
                {
                    if (ReallocWithinBlock(*m_pBlockVectors[i], m_pBlockVectors[i]->GetBlock(0)))
                        break;
                }
            }
        }
    }

    moveInfo.moveCount = static_cast<uint32_t>(m_Moves.size());
    if (moveInfo.moveCount > 0)
    {
        moveInfo.pMoves = m_Moves.data();
        return VK_INCOMPLETE;
    }

    moveInfo.pMoves = VMA_NULL;
    return VK_SUCCESS;
}